

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardKinematics.cpp
# Opt level: O1

bool iDynTree::ForwardPosVelAccKinematics
               (Model *model,Traversal *traversal,FreeFloatingPos *robotPos,
               FreeFloatingVel *robotVel,FreeFloatingAcc *robotAcc,LinkPositions *linkPos,
               LinkVelArray *linkVel,LinkAccArray *linkAcc)

{
  uint uVar1;
  Link *this;
  Link *this_00;
  IJoint *pIVar2;
  JointPosDoubleArray *pJVar3;
  JointDOFsDoubleArray *pJVar4;
  JointDOFsDoubleArray *pJVar5;
  LinkIndex LVar6;
  LinkIndex LVar7;
  Transform *pTVar8;
  Transform *this_01;
  Twist *pTVar9;
  Twist *this_02;
  SpatialAcc *pSVar10;
  SpatialAcc *this_03;
  ulong traversalIndex;
  
  uVar1 = Traversal::getNrOfVisitedLinks(traversal);
  if (uVar1 != 0) {
    traversalIndex = 0;
    do {
      this = Traversal::getLink(traversal,traversalIndex);
      this_00 = Traversal::getParentLink(traversal,traversalIndex);
      pIVar2 = Traversal::getParentJoint(traversal,traversalIndex);
      if (this_00 == (Link *)0x0) {
        pTVar8 = FreeFloatingPos::worldBasePos(robotPos);
        LVar6 = Link::getIndex(this);
        this_01 = LinkPositions::operator()(linkPos,LVar6);
        iDynTree::Transform::operator=(this_01,pTVar8);
        pTVar9 = FreeFloatingVel::baseVel(robotVel);
        LVar6 = Link::getIndex(this);
        this_02 = LinkVelArray::operator()(linkVel,LVar6);
        iDynTree::Twist::operator=(this_02,pTVar9);
        pSVar10 = FreeFloatingAcc::baseAcc(robotAcc);
        LVar6 = Link::getIndex(this);
        this_03 = LinkAccArray::operator()(linkAcc,LVar6);
        iDynTree::SpatialAcc::operator=(this_03,pSVar10);
      }
      else {
        pJVar3 = FreeFloatingPos::jointPos(robotPos);
        pJVar4 = FreeFloatingVel::jointVel(robotVel);
        pJVar5 = FreeFloatingAcc::jointAcc(robotAcc);
        LVar6 = Link::getIndex(this);
        LVar7 = Link::getIndex(this_00);
        (*pIVar2->_vptr_IJoint[0xd])
                  (pIVar2,pJVar3,pJVar4,pJVar5,linkPos,linkVel,linkAcc,LVar6,LVar7);
      }
      traversalIndex = traversalIndex + 1;
      uVar1 = Traversal::getNrOfVisitedLinks(traversal);
    } while (traversalIndex < uVar1);
  }
  return true;
}

Assistant:

bool ForwardPosVelAccKinematics(const Model& model, const Traversal& traversal,
                                const FreeFloatingPos& robotPos,
                                const FreeFloatingVel& robotVel,
                                const FreeFloatingAcc& robotAcc,
                                      LinkPositions& linkPos,
                                      LinkVelArray & linkVel,
                                      LinkAccArray & linkAcc)
{
    bool retValue = true;

    for(unsigned int traversalEl=0; traversalEl < traversal.getNrOfVisitedLinks(); traversalEl++)
    {
        LinkConstPtr visitedLink = traversal.getLink(traversalEl);
        LinkConstPtr parentLink  = traversal.getParentLink(traversalEl);
        IJointConstPtr toParentJoint = traversal.getParentJoint(traversalEl);

        if( parentLink == 0 )
        {
            // If the visited link is the base, the base has no parent.
            // In this case the position of the base with respect to the world is simply
            // the worldBase transform contained in the jointPos input object
            linkPos(visitedLink->getIndex()) = robotPos.worldBasePos();
            linkVel(visitedLink->getIndex()) = robotVel.baseVel();
            linkAcc(visitedLink->getIndex()) = robotAcc.baseAcc();
        }
        else
        {
            // Otherwise we compute the world_H_link transform as:
            // world_H_link = world_H_parentLink * parentLink_H_link
            // The link velocity and acceleration are recursivly
            // compute from the joint position, velocity and acceleration
            // and from the velocity and acceleration of the parent link
            toParentJoint->computeChildPosVelAcc(robotPos.jointPos(),
                                                 robotVel.jointVel(),
                                                 robotAcc.jointAcc(),
                                                 linkPos, linkVel, linkAcc,
                                                 visitedLink->getIndex(),parentLink->getIndex());
        }
    }

    return retValue;

}